

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  WirePointer *pWVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  PointerType PVar10;
  uint uVar11;
  int iVar12;
  ArrayPtr<const_char> AVar13;
  Fault f;
  StructReader local_98;
  SegmentReader *local_68;
  WirePointer *local_60;
  CapTableReader *local_58;
  PointerReader local_50;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  if ((decl->_reader).pointerCount == 0) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.segment = (decl->_reader).segment;
    local_50.capTable = (decl->_reader).capTable;
    local_50.pointer = (decl->_reader).pointers;
    local_50.nestingLimit = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getStruct(&local_98,&local_50,(word *)0x0);
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  local_50.capTable = (CapTableReader *)0x0;
  local_50.nestingLimit = 0x7fffffff;
  if (local_98.pointerCount != 0) {
    local_50.pointer = (WirePointer *)CONCAT44(local_98.pointers._4_4_,(int)local_98.pointers);
    local_50.segment = local_98.segment;
    local_50.capTable = local_98.capTable;
    local_50.nestingLimit = local_98.nestingLimit;
  }
  uVar11 = 0;
  AVar13 = (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  (this->name).content = AVar13;
  pSVar4 = (decl->_reader).segment;
  pCVar5 = (decl->_reader).capTable;
  pvVar3 = (decl->_reader).data;
  pWVar6 = (decl->_reader).pointers;
  SVar7 = (decl->_reader).pointerCount;
  uVar8 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar12 = (decl->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar7;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar8;
  (this->declId)._reader.nestingLimit = iVar12;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar9;
  (this->declId)._reader.data = pvVar3;
  (this->declId)._reader.pointers = pWVar6;
  (this->declId)._reader.segment = pSVar4;
  (this->declId)._reader.capTable = pCVar5;
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  local_98.pointers._0_4_ = 0x7fffffff;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_98.capTable = (CapTableReader *)0x0;
  local_98.data = (WirePointer *)0x0;
  local_98.segment = (SegmentReader *)0x0;
  if (3 < (decl->_reader).pointerCount) {
    local_98.segment = (decl->_reader).segment;
    local_98.capTable = (decl->_reader).capTable;
    local_98.data = (decl->_reader).pointers + 3;
    local_98.pointers._0_4_ = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0
            );
  uVar2 = (decl->_reader).dataSize;
  if (0x3f < uVar2) {
    uVar11 = *(uint *)((long)(decl->_reader).data + 4);
  }
  this->startByte = uVar11;
  uVar11 = 0;
  if (0x5f < uVar2) {
    uVar11 = *(uint *)((long)(decl->_reader).data + 8);
  }
  this->endByte = uVar11;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  uVar2 = (decl->_reader).dataSize;
  if ((0x1f < uVar2) && (*(short *)((long)(decl->_reader).data + 2) == 6)) {
    local_68 = (decl->_reader).segment;
    local_58 = (decl->_reader).capTable;
    local_60 = (decl->_reader).pointers;
    uVar1 = (decl->_reader).pointerCount;
    iVar12 = (decl->_reader).nestingLimit;
    if (uVar1 < 6) {
      local_50.nestingLimit = 0x7fffffff;
      local_50.capTable = (CapTableReader *)0x0;
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)0x0;
    }
    else {
      local_50.pointer = local_60 + 5;
      local_50.capTable = local_58;
      local_50.segment = local_68;
      local_50.nestingLimit = iVar12;
    }
    pvVar3 = (decl->_reader).data;
    capnp::_::PointerReader::getStruct(&local_98,&local_50,(word *)0x0);
    (this->fieldType)._reader.dataSize = local_98.dataSize;
    (this->fieldType)._reader.pointerCount = local_98.pointerCount;
    *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_98._38_2_;
    *(ulong *)&(this->fieldType)._reader.nestingLimit =
         CONCAT44(local_98._44_4_,local_98.nestingLimit);
    (this->fieldType)._reader.data = local_98.data;
    (this->fieldType)._reader.pointers =
         (WirePointer *)CONCAT44(local_98.pointers._4_4_,(int)local_98.pointers);
    (this->fieldType)._reader.segment = local_98.segment;
    (this->fieldType)._reader.capTable = local_98.capTable;
    if ((0x6f < uVar2) && (*(short *)((long)pvVar3 + 0xc) == 1)) {
      this->hasDefaultValue = true;
      if (uVar1 < 7) {
        iVar12 = 0x7fffffff;
        local_50.capTable = (CapTableReader *)0x0;
        local_50.pointer = (WirePointer *)0x0;
        local_50.segment = (SegmentReader *)0x0;
      }
      else {
        local_50.pointer = local_60 + 6;
        local_50.capTable = local_58;
        local_50.segment = local_68;
      }
      local_50.nestingLimit = iVar12;
      capnp::_::PointerReader::getStruct(&local_98,&local_50,(word *)0x0);
      (this->fieldDefaultValue)._reader.dataSize = local_98.dataSize;
      (this->fieldDefaultValue)._reader.pointerCount = local_98.pointerCount;
      *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = local_98._38_2_;
      *(ulong *)&(this->fieldDefaultValue)._reader.nestingLimit =
           CONCAT44(local_98._44_4_,local_98.nestingLimit);
      (this->fieldDefaultValue)._reader.data = local_98.data;
      (this->fieldDefaultValue)._reader.pointers =
           (WirePointer *)CONCAT44(local_98.pointers._4_4_,(int)local_98.pointers);
      (this->fieldDefaultValue)._reader.segment = local_98.segment;
      (this->fieldDefaultValue)._reader.capTable = local_98.capTable;
    }
    if ((decl->_reader).pointerCount < 5) {
      local_98.segment = (SegmentReader *)0x0;
      local_98.capTable = (CapTableReader *)0x0;
      local_98.data = (WirePointer *)0x0;
      local_98.pointers._0_4_ = 0x7fffffff;
    }
    else {
      local_98.segment = (decl->_reader).segment;
      local_98.capTable = (decl->_reader).capTable;
      local_98.data = (decl->_reader).pointers + 4;
      local_98.pointers._0_4_ = (decl->_reader).nestingLimit;
    }
    PVar10 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_98);
    if (PVar10 != NULL_) {
      if ((decl->_reader).pointerCount < 5) {
        local_98.pointers._0_4_ = 0x7fffffff;
        local_98.capTable = (CapTableReader *)0x0;
        local_98.data = (WirePointer *)0x0;
        local_98.segment = (SegmentReader *)0x0;
      }
      else {
        local_98.segment = (decl->_reader).segment;
        local_98.capTable = (decl->_reader).capTable;
        local_98.data = (decl->_reader).pointers + 4;
        local_98.pointers._0_4_ = (decl->_reader).nestingLimit;
      }
      AVar13 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_98,(void *)0x0,0);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar13;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  local_50.segment = (SegmentReader *)0x0;
  local_98.segment = (SegmentReader *)0x0;
  local_98.capTable = (CapTableReader *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_50,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_50);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }